

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::xml_node::print
          (xml_node *this,xml_writer *writer,char_t *indent,uint flags,xml_encoding encoding,
          uint depth)

{
  xml_buffered_writer local_2820;
  
  if (this->_root != (xml_node_struct *)0x0) {
    local_2820.bufsize = 0;
    if ((encoding < encoding_latin1) && ((0x191U >> (encoding & 0x1f) & 1) != 0)) {
      encoding = *(xml_encoding *)(&DAT_00134d14 + (ulong)encoding * 4);
    }
    local_2820.writer = writer;
    local_2820.encoding = encoding;
    impl::anon_unknown_0::node_output(&local_2820,this->_root,indent,flags,depth);
    impl::anon_unknown_0::xml_buffered_writer::flush
              (&local_2820,local_2820.buffer,local_2820.bufsize);
  }
  return;
}

Assistant:

PUGI_IMPL_FN void xml_node::print(xml_writer& writer, const char_t* indent, unsigned int flags, xml_encoding encoding, unsigned int depth) const
	{
		if (!_root) return;

		impl::xml_buffered_writer buffered_writer(writer, encoding);

		impl::node_output(buffered_writer, _root, indent, flags, depth);

		buffered_writer.flush();
	}